

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ecdsa_adaptor.cpp
# Opt level: O0

void __thiscall AdaptorSignature_Recover_Test::TestBody(AdaptorSignature_Recover_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_a0;
  Message local_98;
  string local_90;
  string local_60;
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  Privkey sec;
  AdaptorSignature_Recover_Test *this_local;
  
  cfd::core::AdaptorSignature::Recover
            ((Privkey *)&gtest_ar.message_,&adaptor_sig2,&compact_sig,&adaptor);
  cfd::core::Privkey::GetHex_abi_cxx11_(&local_60,&secret);
  cfd::core::Privkey::GetHex_abi_cxx11_(&local_90,(Privkey *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_40,"secret.GetHex()","sec.GetHex()",&local_60,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_40);
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_ecdsa_adaptor.cpp"
               ,0x39,message);
    testing::internal::AssertHelper::operator=(&local_a0,&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  cfd::core::Privkey::~Privkey((Privkey *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(AdaptorSignature, Recover) {
  auto sec = adaptor_sig2.Recover(compact_sig, adaptor);

  EXPECT_EQ(secret.GetHex(), sec.GetHex());
}